

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::ILikeOperatorFunction(string_t *str,string_t *pattern,char escape)

{
  bool bVar1;
  idx_t iVar2;
  char *result_data;
  idx_t iVar3;
  char *result_data_00;
  ulong input_length;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  ulong input_length_00;
  uint uVar7;
  string_t pat_lcase;
  string_t str_lcase;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  uint local_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  
  input_length_00 = (ulong)(str->value).pointer.length;
  if (input_length_00 < 0xd) {
    pcVar6 = (str->value).pointer.prefix;
  }
  else {
    pcVar6 = (str->value).pointer.ptr;
  }
  input_length = (ulong)(pattern->value).pointer.length;
  if (input_length < 0xd) {
    pcVar4 = (pattern->value).pointer.prefix;
  }
  else {
    pcVar4 = (pattern->value).pointer.ptr;
  }
  iVar2 = GetResultLength<false>(pcVar6,input_length_00);
  result_data = (char *)operator_new__(iVar2);
  CaseConvert<false>(pcVar6,input_length_00,result_data);
  iVar3 = GetResultLength<false>(pcVar4,input_length);
  result_data_00 = (char *)operator_new__(iVar3);
  CaseConvert<false>(pcVar4,input_length,result_data_00);
  pcVar6 = (char *)&local_3c;
  uVar7 = (uint)iVar2;
  local_40 = uVar7;
  if (uVar7 < 0xd) {
    local_34 = 0;
    local_3c = 0;
    uStack_38 = 0;
    if (uVar7 != 0) {
      switchD_012dd528::default(pcVar6,result_data,(ulong)(uVar7 & 0xf));
    }
  }
  else {
    local_3c = *(undefined4 *)result_data;
    uStack_38 = SUB84(result_data,0);
    local_34 = (undefined4)((ulong)result_data >> 0x20);
  }
  pcVar4 = (char *)&local_4c;
  uVar5 = (uint)iVar3;
  if (uVar5 < 0xd) {
    local_44 = 0;
    local_4c = 0;
    uStack_48 = 0;
    if (uVar5 != 0) {
      switchD_012dd528::default(pcVar4,result_data_00,(ulong)(uVar5 & 0xf));
    }
  }
  else {
    local_4c = *(undefined4 *)result_data_00;
    uStack_48 = SUB84(result_data_00,0);
    local_44 = (undefined4)((ulong)result_data_00 >> 0x20);
  }
  if (0xc < uVar7) {
    pcVar6 = (char *)CONCAT44(local_34,uStack_38);
  }
  if (0xc < uVar5) {
    pcVar4 = (char *)CONCAT44(local_44,uStack_48);
  }
  bVar1 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                    (pcVar6,iVar2 & 0xffffffff,pcVar4,iVar3 & 0xffffffff,escape);
  operator_delete__(result_data_00);
  operator_delete__(result_data);
  return bVar1;
}

Assistant:

bool ILikeOperatorFunction(string_t &str, string_t &pattern, char escape = '\0') {
	auto str_data = str.GetData();
	auto str_size = str.GetSize();
	auto pat_data = pattern.GetData();
	auto pat_size = pattern.GetSize();

	// lowercase both the str and the pattern
	idx_t str_llength = LowerLength(str_data, str_size);
	auto str_ldata = make_unsafe_uniq_array_uninitialized<char>(str_llength);
	LowerCase(str_data, str_size, str_ldata.get());

	idx_t pat_llength = LowerLength(pat_data, pat_size);
	auto pat_ldata = make_unsafe_uniq_array_uninitialized<char>(pat_llength);
	LowerCase(pat_data, pat_size, pat_ldata.get());
	string_t str_lcase(str_ldata.get(), UnsafeNumericCast<uint32_t>(str_llength));
	string_t pat_lcase(pat_ldata.get(), UnsafeNumericCast<uint32_t>(pat_llength));
	return LikeOperatorFunction(str_lcase, pat_lcase, escape);
}